

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string_view key;
  string_view value;
  exception *e;
  basic_string_view<char,_std::char_traits<char>_> local_1590;
  undefined1 local_1580 [40];
  address local_1558;
  basic_endpoint<boost::asio::ip::tcp> local_1534;
  io_context local_1518;
  shared_ptr<mini_bus::ConnectionInfo> local_1508;
  undefined1 local_14f8 [8];
  MiniBusClient client;
  undefined1 local_28 [8];
  io_service service;
  char **argv_local;
  int argc_local;
  
  service.impl_ = (impl_type *)argv;
  boost::asio::io_context::io_context((io_context *)local_28);
  boost::asio::ip::address::from_string(&local_1558,"127.0.0.1");
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&local_1534,&local_1558,0xfc8);
  local_1580._32_8_ = s<(char)53>();
  std::
  make_shared<AutoReconnectConnection,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::chrono::duration<long,std::ratio<1l,1l>>,main::__0>
            (&local_1518,(basic_endpoint<boost::asio::ip::tcp> *)local_28,
             (duration<long,_std::ratio<1L,_1L>_> *)&local_1534,
             (anon_class_1_0_00000001 *)(local_1580 + 0x20));
  std::shared_ptr<mini_bus::ConnectionInfo>::shared_ptr<AutoReconnectConnection,void>
            (&local_1508,(shared_ptr<AutoReconnectConnection> *)&local_1518);
  mini_bus::MiniBusClient::MiniBusClient((MiniBusClient *)local_14f8,&local_1508);
  std::shared_ptr<mini_bus::ConnectionInfo>::~shared_ptr(&local_1508);
  std::shared_ptr<AutoReconnectConnection>::~shared_ptr
            ((shared_ptr<AutoReconnectConnection> *)&local_1518);
  do {
    local_1580._16_8_ = s<(char)49>();
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)(local_1580 + 0x10));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1590,"event");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&e,"notify");
    key._M_str = (char *)local_1590._M_len;
    key._M_len = (size_t)local_14f8;
    value._M_str = (char *)e;
    value._M_len = (size_t)local_1590._M_str;
    mini_bus::MiniBusClient::notify((MiniBusClient *)local_1580,key,value);
    std::shared_ptr<mini_bus::IBaseNotifyToken<void>_>::~shared_ptr
              ((shared_ptr<mini_bus::IBaseNotifyToken<void>_> *)local_1580);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::chrono_literals;
  try {
    io_service service;
    MiniBusClient client{std::make_shared<AutoReconnectConnection>(
        service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040}, 5s, [](MiniBusClient &client) {
          client.register_handler("echo", [](auto inp) { return std::string{inp}; });
          client.set("registry", "demo", "(value will be ignored)")->wait();
          client.set_private("key", "value")->wait();
        })};
    while (true) {
      std::this_thread::sleep_for(1s);
      try {
        client.notify("event", "notify");
      } catch (...) {
        std::cout << "failed to send notify" << std::endl;
      }
    }
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}